

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

CPAccessResult gt_counter_access(CPUARMState_conflict *env,int timeridx,_Bool isread)

{
  ulong uVar1;
  byte bVar2;
  uint64_t uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar4 = env->uncached_cpsr & 0x1f;
      if (uVar4 == 0x10) {
        uVar4 = 0;
      }
      else if (uVar4 == 0x16) {
LAB_0061ce52:
        uVar4 = 3;
      }
      else if (uVar4 == 0x1a) {
        uVar4 = 2;
      }
      else {
        if ((uVar1 & 0x200000000) != 0) {
          if (uVar4 == 0x16) {
            uVar4 = 3;
            if (((uint)uVar1 >> 0x1c & 1) == 0) goto LAB_0061ce58;
          }
          else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) goto LAB_0061ce52;
        }
        uVar4 = 1;
      }
    }
    else {
      uVar4 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar4 = 1;
    if ((env->v7m).exception == 0) {
      uVar4 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0061ce58:
  if ((uVar1 & 0x200000000) == 0) {
    bVar5 = false;
  }
  else {
    if (env->aarch64 == 0) {
      bVar5 = true;
      if ((env->uncached_cpsr & 0x1f) == 0x16) goto LAB_0061ce89;
    }
    else {
      bVar5 = true;
      if ((~env->pstate & 0xc) == 0) goto LAB_0061ce89;
    }
    bVar5 = ((env->cp15).scr_el3 & 1) == 0;
  }
LAB_0061ce89:
  uVar3 = arm_hcr_el2_eff_aarch64(env);
  if (uVar4 == 1) {
    if (!(bool)(timeridx != 0 | bVar5 | (uVar1 >> 0x20 & 1) == 0)) {
      uVar4 = (env->cp15).cnthctl_el2;
      if ((uVar3 >> 0x22 & 1) != 0) {
        uVar4 = uVar4 >> 10;
      }
      if ((uVar4 & 1) == 0) {
        return CP_ACCESS_TRAP_EL2;
      }
    }
  }
  else if (uVar4 == 0) {
    if ((~uVar3 & 0x408000000) == 0) {
      if (timeridx != 0x20) {
        return (uint)(((env->cp15).cnthctl_el2 >> (timeridx & 0x1fU) & 1) == 0) * 3;
      }
    }
    else if (timeridx != 0x20) {
      if (((uint)(env->cp15).c14_cntkctl >> (timeridx & 0x1fU) & 1) == 0) {
        return CP_ACCESS_TRAP;
      }
      if ((uVar3 & 0x400000000) == 0) {
        if ((timeridx != 0 || bVar5) || (uVar1 >> 0x20 & 1) == 0) {
          return CP_ACCESS_OK;
        }
        bVar2 = (byte)(env->cp15).cnthctl_el2 & 2;
      }
      else {
        if (timeridx != 0) {
          return CP_ACCESS_OK;
        }
        bVar2 = *(byte *)((long)&(env->cp15).cnthctl_el2 + 1) & 4;
      }
      if (bVar2 != 0) {
        return CP_ACCESS_OK;
      }
      return CP_ACCESS_TRAP_EL2;
    }
    __assert_fail("start >= 0 && length > 0 && length <= 32 - start",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/bitops.h"
                  ,0x11f,"uint32_t extract32(uint32_t, int, int)");
  }
  return CP_ACCESS_OK;
}

Assistant:

static CPAccessResult gt_counter_access(CPUARMState *env, int timeridx,
                                        bool isread)
{
    unsigned int cur_el = arm_current_el(env);
    bool secure = arm_is_secure(env);
    uint64_t hcr = arm_hcr_el2_eff(env);

    switch (cur_el) {
    case 0:
        /* If HCR_EL2.<E2H,TGE> == '11': check CNTHCTL_EL2.EL0[PV]CTEN. */
        if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
            return (extract32(env->cp15.cnthctl_el2, timeridx, 1)
                    ? CP_ACCESS_OK : CP_ACCESS_TRAP_EL2);
        }

        /* CNT[PV]CT: not visible from PL0 if EL0[PV]CTEN is zero */
        if (!extract32(env->cp15.c14_cntkctl, timeridx, 1)) {
            return CP_ACCESS_TRAP;
        }

        /* If HCR_EL2.<E2H,TGE> == '10': check CNTHCTL_EL2.EL1PCTEN. */
        if (hcr & HCR_E2H) {
            if (timeridx == GTIMER_PHYS &&
                !extract32(env->cp15.cnthctl_el2, 10, 1)) {
                return CP_ACCESS_TRAP_EL2;
            }
        } else {
            /* If HCR_EL2.<E2H> == 0: check CNTHCTL_EL2.EL1PCEN. */
            if (arm_feature(env, ARM_FEATURE_EL2) &&
                timeridx == GTIMER_PHYS && !secure &&
                !extract32(env->cp15.cnthctl_el2, 1, 1)) {
                return CP_ACCESS_TRAP_EL2;
            }
        }
        break;

    case 1:
        /* Check CNTHCTL_EL2.EL1PCTEN, which changes location based on E2H. */
        if (arm_feature(env, ARM_FEATURE_EL2) &&
            timeridx == GTIMER_PHYS && !secure &&
            (hcr & HCR_E2H
             ? !extract32(env->cp15.cnthctl_el2, 10, 1)
             : !extract32(env->cp15.cnthctl_el2, 0, 1))) {
            return CP_ACCESS_TRAP_EL2;
        }
        break;
    }
    return CP_ACCESS_OK;
}